

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O3

void __thiscall
solitaire::graphics::Renderer::throwOnInvalidSelectedCardIndex
          (Renderer *this,Cards *pileCards,SelectedCardIndex *selectedCardIndex)

{
  runtime_error *this_00;
  
  if (((selectedCardIndex->super__Optional_base<unsigned_int,_true,_true>)._M_payload.
       super__Optional_payload_base<unsigned_int>._M_engaged == true) &&
     ((ulong)((long)(pileCards->
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(pileCards->
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) <=
      (ulong)(selectedCardIndex->super__Optional_base<unsigned_int,_true,_true>)._M_payload.
             super__Optional_payload_base<unsigned_int>._M_payload._M_value)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    if ((selectedCardIndex->super__Optional_base<unsigned_int,_true,_true>)._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged != false) {
      std::runtime_error::runtime_error
                (this_00,"Cannot get Stock pile card with index: " +
                         (selectedCardIndex->super__Optional_base<unsigned_int,_true,_true>).
                         _M_payload.super__Optional_payload_base<unsigned_int>._M_payload._M_value);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__throw_bad_optional_access();
  }
  return;
}

Assistant:

void Renderer::throwOnInvalidSelectedCardIndex(
    const Cards& pileCards, const SelectedCardIndex& selectedCardIndex) const
{
    if (selectedCardIndex and selectedCardIndex >= pileCards.size())
        throw std::runtime_error {
            "Cannot get Stock pile card with index: " + selectedCardIndex.value()};
}